

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

int xmlSaveDocInternal(xmlSaveCtxtPtr ctxt,xmlDocPtr cur,xmlChar *encoding)

{
  xmlElementType xVar1;
  xmlOutputBufferPtr buf;
  xmlNodePtr cur_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  xmlChar *pxVar5;
  xmlDtdPtr pxVar6;
  char *data;
  uint uVar7;
  xmlNodePtr child;
  
  buf = ctxt->buf;
  xmlInitParser();
  xVar1 = cur->type;
  if ((xVar1 | XML_CDATA_SECTION_NODE) != XML_HTML_DOCUMENT_NODE) {
    return -1;
  }
  if (encoding == (xmlChar *)0x0) {
    encoding = cur->encoding;
  }
  uVar4 = ctxt->options;
  if (((uVar4 & 0x30) != 0 || xVar1 != XML_HTML_DOCUMENT_NODE) && ((uVar4 & 0x40) == 0)) {
    if (xVar1 != XML_DOCUMENT_NODE && (uVar4 & 0x30) == 0) {
      return 0;
    }
    bVar2 = false;
    if ((encoding != (xmlChar *)0x0) && (ctxt->encoding == (xmlChar *)0x0)) {
      iVar3 = xmlSaveSwitchEncoding(ctxt,(char *)encoding);
      if (iVar3 < 0) {
        return -1;
      }
      uVar4 = ctxt->options;
      bVar2 = true;
    }
    if ((uVar4 & 2) == 0) {
      xmlOutputBufferWrite(buf,0xe,"<?xml version=");
      if (cur->version == (xmlChar *)0x0) {
        xmlOutputBufferWrite(buf,5,"\"1.0\"");
      }
      else {
        xmlOutputBufferWriteQuotedString(buf,cur->version);
      }
      if (encoding != (xmlChar *)0x0) {
        xmlOutputBufferWrite(buf,10," encoding=");
        xmlOutputBufferWriteQuotedString(buf,encoding);
      }
      if (cur->standalone == 1) {
        data = " standalone=\"yes\"";
        iVar3 = 0x11;
LAB_0016d99f:
        xmlOutputBufferWrite(buf,iVar3,data);
      }
      else if (cur->standalone == 0) {
        data = " standalone=\"no\"";
        iVar3 = 0x10;
        goto LAB_0016d99f;
      }
      xmlOutputBufferWrite(buf,3,"?>\n");
      uVar4 = ctxt->options;
    }
    uVar7 = uVar4 >> 4 & 1;
    if (((uVar4 & 8) == 0) && (pxVar6 = xmlGetIntSubset(cur), pxVar6 != (xmlDtdPtr)0x0)) {
      uVar4 = xmlIsXHTML(pxVar6->SystemID,pxVar6->ExternalID);
      uVar7 = 0;
      if (0 < (int)uVar4) {
        uVar7 = uVar4;
      }
    }
    for (cur_00 = cur->children; cur_00 != (xmlNodePtr)0x0; cur_00 = cur_00->next) {
      ctxt->level = 0;
      if (uVar7 == 0) {
        xmlNodeDumpOutputInternal(ctxt,cur_00);
      }
      else {
        xhtmlNodeDumpOutput(ctxt,cur_00);
      }
      if (1 < cur_00->type - XML_XINCLUDE_START) {
        xmlOutputBufferWrite(buf,1,"\n");
      }
    }
    goto LAB_0016d91a;
  }
  if (encoding == (xmlChar *)0x0) {
    if (ctxt->encoding == (xmlChar *)0x0) {
      pxVar5 = htmlGetMetaEncoding(cur);
      encoding = (xmlChar *)"HTML";
      if (pxVar5 != (xmlChar *)0x0) {
        encoding = pxVar5;
      }
      goto LAB_0016d8ed;
    }
LAB_0016d8d2:
    bVar2 = false;
  }
  else {
    htmlSetMetaEncoding(cur,encoding);
    if (ctxt->encoding != (xmlChar *)0x0) goto LAB_0016d8d2;
LAB_0016d8ed:
    iVar3 = xmlSaveSwitchEncoding(ctxt,(char *)encoding);
    bVar2 = true;
    if (iVar3 < 0) {
      return -1;
    }
  }
  htmlDocContentDumpFormatOutput(buf,cur,(char *)0x0,ctxt->options & 1);
LAB_0016d91a:
  if (bVar2) {
    xmlSaveClearEncoding(ctxt);
  }
  return 0;
}

Assistant:

static int
xmlSaveDocInternal(xmlSaveCtxtPtr ctxt, xmlDocPtr cur,
                   const xmlChar *encoding) {
#ifdef LIBXML_HTML_ENABLED
    xmlDtdPtr dtd;
    int is_xhtml = 0;
#endif
    xmlOutputBufferPtr buf = ctxt->buf;
    int switched_encoding = 0;

    xmlInitParser();

    if ((cur->type != XML_HTML_DOCUMENT_NODE) &&
        (cur->type != XML_DOCUMENT_NODE))
	 return(-1);

    if (encoding == NULL)
	encoding = cur->encoding;

    if (((cur->type == XML_HTML_DOCUMENT_NODE) &&
         ((ctxt->options & XML_SAVE_AS_XML) == 0) &&
         ((ctxt->options & XML_SAVE_XHTML) == 0)) ||
        (ctxt->options & XML_SAVE_AS_HTML)) {
#ifdef LIBXML_HTML_ENABLED
        int format = 0;

        if (encoding != NULL)
	    htmlSetMetaEncoding(cur, encoding);

	if (ctxt->encoding == NULL) {
            if (encoding == NULL) {
                encoding = htmlGetMetaEncoding(cur);

                if (encoding == NULL)
                    encoding = BAD_CAST "HTML";
            }

	    if (xmlSaveSwitchEncoding(ctxt, (const char*) encoding) < 0) {
		return(-1);
	    }
            switched_encoding = 1;
	}

        if (ctxt->options & XML_SAVE_FORMAT)
            format = 1;
        htmlDocContentDumpFormatOutput(buf, cur, NULL, format);
#else
        return(-1);
#endif
    } else if ((cur->type == XML_DOCUMENT_NODE) ||
               (ctxt->options & XML_SAVE_AS_XML) ||
               (ctxt->options & XML_SAVE_XHTML)) {
	if ((encoding != NULL) && (ctxt->encoding == NULL)) {
            if (xmlSaveSwitchEncoding(ctxt, (const char *) encoding) < 0)
                return(-1);
            switched_encoding = 1;
	}

	/*
	 * Save the XML declaration
	 */
	if ((ctxt->options & XML_SAVE_NO_DECL) == 0) {
	    xmlOutputBufferWrite(buf, 14, "<?xml version=");
	    if (cur->version != NULL)
		xmlOutputBufferWriteQuotedString(buf, cur->version);
	    else
		xmlOutputBufferWrite(buf, 5, "\"1.0\"");
	    if (encoding != NULL) {
		xmlOutputBufferWrite(buf, 10, " encoding=");
		xmlOutputBufferWriteQuotedString(buf, (xmlChar *) encoding);
	    }
	    switch (cur->standalone) {
		case 0:
		    xmlOutputBufferWrite(buf, 16, " standalone=\"no\"");
		    break;
		case 1:
		    xmlOutputBufferWrite(buf, 17, " standalone=\"yes\"");
		    break;
	    }
	    xmlOutputBufferWrite(buf, 3, "?>\n");
	}

#ifdef LIBXML_HTML_ENABLED
        if (ctxt->options & XML_SAVE_XHTML)
            is_xhtml = 1;
	if ((ctxt->options & XML_SAVE_NO_XHTML) == 0) {
	    dtd = xmlGetIntSubset(cur);
	    if (dtd != NULL) {
		is_xhtml = xmlIsXHTML(dtd->SystemID, dtd->ExternalID);
		if (is_xhtml < 0) is_xhtml = 0;
	    }
	}
#endif
	if (cur->children != NULL) {
	    xmlNodePtr child = cur->children;

	    while (child != NULL) {
		ctxt->level = 0;
#ifdef LIBXML_HTML_ENABLED
		if (is_xhtml)
		    xhtmlNodeDumpOutput(ctxt, child);
		else
#endif
		    xmlNodeDumpOutputInternal(ctxt, child);
                if ((child->type != XML_XINCLUDE_START) &&
                    (child->type != XML_XINCLUDE_END))
                    xmlOutputBufferWrite(buf, 1, "\n");
		child = child->next;
	    }
	}
    }

    /*
     * Restore the state of the saving context at the end of the document
     */
    if (switched_encoding) {
	xmlSaveClearEncoding(ctxt);
    }

    return(0);
}